

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

void __thiscall
cmServerProtocol1::GeneratorInformation::GeneratorInformation
          (GeneratorInformation *this,string *generatorName,string *extraGeneratorName,
          string *toolset,string *platform,string *sourceDirectory,string *buildDirectory)

{
  pointer pcVar1;
  
  (this->GeneratorName)._M_dataplus._M_p = (pointer)&(this->GeneratorName).field_2;
  pcVar1 = (generatorName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + generatorName->_M_string_length);
  (this->ExtraGeneratorName)._M_dataplus._M_p = (pointer)&(this->ExtraGeneratorName).field_2;
  pcVar1 = (extraGeneratorName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ExtraGeneratorName,pcVar1,
             pcVar1 + extraGeneratorName->_M_string_length);
  (this->Toolset)._M_dataplus._M_p = (pointer)&(this->Toolset).field_2;
  pcVar1 = (toolset->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Toolset,pcVar1,pcVar1 + toolset->_M_string_length);
  (this->Platform)._M_dataplus._M_p = (pointer)&(this->Platform).field_2;
  pcVar1 = (platform->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Platform,pcVar1,pcVar1 + platform->_M_string_length);
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  pcVar1 = (sourceDirectory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->SourceDirectory,pcVar1,pcVar1 + sourceDirectory->_M_string_length);
  (this->BuildDirectory)._M_dataplus._M_p = (pointer)&(this->BuildDirectory).field_2;
  pcVar1 = (buildDirectory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->BuildDirectory,pcVar1,pcVar1 + buildDirectory->_M_string_length);
  return;
}

Assistant:

cmServerProtocol1::GeneratorInformation::GeneratorInformation(
  const std::string& generatorName, const std::string& extraGeneratorName,
  const std::string& toolset, const std::string& platform,
  const std::string& sourceDirectory, const std::string& buildDirectory)
  : GeneratorName(generatorName)
  , ExtraGeneratorName(extraGeneratorName)
  , Toolset(toolset)
  , Platform(platform)
  , SourceDirectory(sourceDirectory)
  , BuildDirectory(buildDirectory)
{
}